

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

void __thiscall
stk::FileWrite::FileWrite
          (FileWrite *this,string *fileName,uint nChannels,FILE_TYPE type,StkFormat format)

{
  string asStack_48 [32];
  
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileWrite_00115d28;
  this->fd_ = (FILE *)0x0;
  std::__cxx11::string::string(asStack_48,(string *)fileName);
  open(this,(char *)asStack_48,nChannels,type,format);
  std::__cxx11::string::~string(asStack_48);
  return;
}

Assistant:

FileWrite::FileWrite( std::string fileName, unsigned int nChannels, FILE_TYPE type, Stk::StkFormat format )
  : fd_( 0 )
{
  this->open( fileName, nChannels, type, format );
}